

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int dec_mem(em8051 *aCPU)

{
  uint uVar1;
  int address;
  em8051 *aCPU_local;
  
  uVar1 = (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  if (uVar1 < 0x80) {
    aCPU->mLowerData[(int)uVar1] = aCPU->mLowerData[(int)uVar1] + 0xff;
  }
  else {
    aCPU->mSFR[(int)(uVar1 - 0x80)] = aCPU->mSFR[(int)(uVar1 - 0x80)] + 0xff;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,uVar1);
    }
  }
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int dec_mem(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80]--;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address]--;
    }
    PC += 2;
    return 0;
}